

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void gamma_transform_test
               (png_modifier *pm,png_byte colour_type,png_byte bit_depth,int palette_number,
               int interlace_type,double file_gamma,double screen_gamma,png_byte sbit,
               int use_input_precision,int scale16)

{
  size_t sVar1;
  char local_98 [8];
  char name [64];
  size_t local_50;
  size_t pos;
  png_byte sbit_local;
  double screen_gamma_local;
  double file_gamma_local;
  int interlace_type_local;
  int palette_number_local;
  png_byte bit_depth_local;
  png_byte colour_type_local;
  png_modifier *pm_local;
  
  if ((sbit == bit_depth) || (sbit == '\0')) {
    local_50 = safecat(local_98,0x40,0,"gamma ");
  }
  else {
    sVar1 = safecat(local_98,0x40,0,"sbit(");
    sVar1 = safecatn(local_98,0x40,sVar1,(uint)sbit);
    local_50 = safecat(local_98,0x40,sVar1,") ");
  }
  if (scale16 != 0) {
    local_50 = safecat(local_98,0x40,local_50,"16to8 ");
  }
  sVar1 = safecatd(local_98,0x40,local_50,file_gamma,3);
  sVar1 = safecat(local_98,0x40,sVar1,"->");
  safecatd(local_98,0x40,sVar1,screen_gamma,3);
  gamma_test(pm,colour_type,bit_depth,palette_number,interlace_type,file_gamma,screen_gamma,sbit,0,
             local_98,use_input_precision,scale16,*(uint *)&pm->field_0x63c >> 0x18 & 1,0,
             (png_color_16 *)0x0,0.0);
  return;
}

Assistant:

static void gamma_transform_test(png_modifier *pm,
   png_byte colour_type, png_byte bit_depth,
   int palette_number,
   int interlace_type, const double file_gamma,
   const double screen_gamma, png_byte sbit,
   int use_input_precision, int scale16)
{
   size_t pos = 0;
   char name[64];

   if (sbit != bit_depth && sbit != 0)
   {
      pos = safecat(name, sizeof name, pos, "sbit(");
      pos = safecatn(name, sizeof name, pos, sbit);
      pos = safecat(name, sizeof name, pos, ") ");
   }

   else
      pos = safecat(name, sizeof name, pos, "gamma ");

   if (scale16)
      pos = safecat(name, sizeof name, pos, "16to8 ");

   pos = safecatd(name, sizeof name, pos, file_gamma, 3);
   pos = safecat(name, sizeof name, pos, "->");
   pos = safecatd(name, sizeof name, pos, screen_gamma, 3);

   gamma_test(pm, colour_type, bit_depth, palette_number, interlace_type,
      file_gamma, screen_gamma, sbit, 0, name, use_input_precision,
      scale16, pm->test_gamma_expand16, 0 , 0, 0);
}